

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::parse_request_line(Server *this,char *s,Request *req)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  anon_class_16_2_0af4f598 *__f;
  long lVar6;
  long lVar7;
  long in_RDX;
  char *in_RSI;
  size_t count_1;
  size_t i;
  size_t count;
  size_t len;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  anon_class_16_2_0af4f598 *in_stack_fffffffffffffcb8;
  function<void_(const_char_*,_const_char_*)> *in_stack_fffffffffffffcc0;
  allocator<char> *in_stack_fffffffffffffce0;
  function<void_(const_char_*,_const_char_*)> *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  char in_stack_fffffffffffffcf7;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd00;
  iterator in_stack_fffffffffffffd08;
  string *psVar8;
  size_type in_stack_fffffffffffffd10;
  ulong local_1f0;
  _Self local_1e8;
  _Self local_1e0;
  undefined1 local_1d3;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  allocator<char> local_1d0;
  allocator<char> local_1cf;
  allocator<char> local_1ce;
  allocator<char> local_1cd;
  allocator<char> local_1cc;
  allocator<char> local_1cb;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  string *local_1c8;
  string local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  string *local_80;
  undefined8 local_78;
  long *local_60;
  long local_58;
  long local_30;
  long local_28;
  long local_20;
  char *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar3 = strlen(in_RSI);
  if (((sVar3 < 2) || (local_18[sVar3 - 2] != '\r')) || (local_18[sVar3 - 1] != '\n')) {
    local_1 = false;
  }
  else {
    local_28 = sVar3 - 2;
    local_30 = 0;
    local_60 = &local_30;
    local_58 = local_20;
    std::function<void(char_const*,char_const*)>::
    function<httplib::Server::parse_request_line(char_const*,httplib::Request&)::_lambda(char_const*,char_const*)_1_,void>
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    detail::split((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                  in_stack_fffffffffffffcf7,in_stack_fffffffffffffce8);
    std::function<void_(const_char_*,_const_char_*)>::~function
              ((function<void_(const_char_*,_const_char_*)> *)0x1ca907);
    if (local_30 == 3) {
      if ((parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&parse_request_line(char_const*,httplib::Request&)::
                                       methods_abi_cxx11_), iVar2 != 0)) {
        local_1d3 = 1;
        local_1c8 = local_1c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1c8 = (string *)local_1a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1c8 = (string *)local_180;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1c8 = (string *)local_160;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1c8 = (string *)local_140;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1c8 = (string *)local_120;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1c8 = (string *)local_100;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1c8 = (string *)local_e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1c8 = (string *)local_c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1c8 = (string *)local_a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        local_1d3 = 0;
        local_80 = local_1c0;
        local_78 = 10;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1cac8d);
        __l._M_len = in_stack_fffffffffffffd10;
        __l._M_array = in_stack_fffffffffffffd08;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd00,__l,in_stack_fffffffffffffcf8,
              (allocator_type *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1cacc5);
        psVar8 = local_1c0;
        in_stack_fffffffffffffd00 = (string *)&local_80;
        do {
          in_stack_fffffffffffffd00 = in_stack_fffffffffffffd00 + -0x20;
          std::__cxx11::string::~string(in_stack_fffffffffffffd00);
        } while (in_stack_fffffffffffffd00 != psVar8);
        std::allocator<char>::~allocator(&local_1d2);
        std::allocator<char>::~allocator(&local_1d1);
        std::allocator<char>::~allocator(&local_1d0);
        std::allocator<char>::~allocator(&local_1cf);
        std::allocator<char>::~allocator(&local_1ce);
        std::allocator<char>::~allocator(&local_1cd);
        std::allocator<char>::~allocator(&local_1cc);
        std::allocator<char>::~allocator(&local_1cb);
        std::allocator<char>::~allocator(&local_1ca);
        std::allocator<char>::~allocator(&local_1c9);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_);
      }
      local_1e0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(in_stack_fffffffffffffca8,(key_type *)0x1cadc0);
      local_1e8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_stack_fffffffffffffca8);
      bVar1 = std::operator==(&local_1e0,&local_1e8);
      if (bVar1) {
        local_1 = false;
      }
      else {
        bVar1 = std::operator!=(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
        if ((bVar1) &&
           (bVar1 = std::operator!=(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8),
           bVar1)) {
          local_1 = false;
        }
        else {
          for (local_1f0 = 0; uVar4 = std::__cxx11::string::size(), local_1f0 < uVar4;
              local_1f0 = local_1f0 + 1) {
            pcVar5 = (char *)std::__cxx11::string::operator[](local_20 + 0xd8);
            if (*pcVar5 == '#') {
              std::__cxx11::string::erase(local_20 + 0xd8,local_1f0);
              break;
            }
          }
          __f = (anon_class_16_2_0af4f598 *)std::__cxx11::string::data();
          lVar6 = std::__cxx11::string::data();
          lVar7 = std::__cxx11::string::size();
          std::function<void(char_const*,char_const*)>::
          function<httplib::Server::parse_request_line(char_const*,httplib::Request&)::_lambda(char_const*,char_const*)_2_,void>
                    ((function<void_(const_char_*,_const_char_*)> *)(lVar6 + lVar7),__f);
          detail::split((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                        in_stack_fffffffffffffcf7,in_stack_fffffffffffffce8);
          std::function<void_(const_char_*,_const_char_*)>::~function
                    ((function<void_(const_char_*,_const_char_*)> *)0x1cb1f6);
          local_1 = true;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

inline bool Server::parse_request_line(const char* s, Request& req) {
        auto len = strlen(s);
        if (len < 2 || s[len - 2] != '\r' || s[len - 1] != '\n') { return false; }
        len -= 2;

        {
            size_t count = 0;

            detail::split(s, s + len, ' ', [&](const char* b, const char* e) {
                switch (count) {
                    case 0: req.method = std::string(b, e); break;
                    case 1: req.target = std::string(b, e); break;
                    case 2: req.version = std::string(b, e); break;
                    default: break;
                }
                count++;
            });

            if (count != 3) { return false; }
        }

        static const std::set<std::string> methods{
            "GET",     "HEAD",    "POST",  "PUT",   "DELETE",
            "CONNECT", "OPTIONS", "TRACE", "PATCH", "PRI" };

        if (methods.find(req.method) == methods.end()) { return false; }

        if (req.version != "HTTP/1.1" && req.version != "HTTP/1.0") { return false; }

        {
            // Skip URL fragment
            for (size_t i = 0; i < req.target.size(); i++) {
                if (req.target[i] == '#') {
                    req.target.erase(i);
                    break;
                }
            }

            size_t count = 0;

            detail::split(req.target.data(), req.target.data() + req.target.size(), '?',
                [&](const char* b, const char* e) {
                switch (count) {
                    case 0:
                        req.path = detail::decode_url(std::string(b, e), false);
                        break;
                    case 1:
                    {
                        if (e - b > 0) {
                            detail::parse_query_text(std::string(b, e), req.params);
                        }
                        break;
                    }
                    default: break;
                }
                count++;
            });

            if (count > 2) { return false; }
        }

        return true;
    }